

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile_s.c
# Opt level: O0

int main(void)

{
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    FILE * fh;
    char filename[ L_tmpnam ];
    FILE * fhtest;
    set_constraint_handler_s( test_handler );

    TESTCASE( ( tmpfile_s( &fh ) ) == 0 );
    TESTCASE( fputc( 'x', fh ) == 'x' );
    /* Checking that file is actually there */
    TESTCASE_NOREG( strcpy( filename, fh->filename ) == filename );
    TESTCASE_NOREG( ( fhtest = fopen( filename, "r" ) ) != NULL );
    TESTCASE_NOREG( fclose( fhtest ) == 0 );
    /* Closing tmpfile */
    TESTCASE( fclose( fh ) == 0 );
    /* Checking that file was deleted */
    TESTCASE_NOREG( fopen( filename, "r" ) == NULL );

    /* Constraint violation */
    TESTCASE( ( tmpfile_s( NULL ) ) != 0 );

    TESTCASE( HANDLER_CALLS == 1 );
#endif
    return TEST_RESULTS;
}